

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiBufferViewAccessTests.cpp
# Opt level: O3

TestStatus * __thiscall
vkt::api::anon_unknown_0::BufferViewTestInstance::checkResult
          (TestStatus *__return_storage_ptr__,BufferViewTestInstance *this,deInt8 factor)

{
  TextureFormat TVar1;
  long lVar2;
  VkDeviceSize size;
  DeviceInterface *vkd;
  VkDevice device;
  TextureLevel *this_00;
  ostream *this_01;
  TestStatus *extraout_RAX;
  int y;
  ChannelOrder CVar3;
  MovePtr<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_> resultLevel;
  ConstPixelBufferAccess pixelBuffer;
  TextureFormat tcuFormat;
  IVec4 pixel;
  ostringstream errorMessage;
  UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_> local_218;
  TextureFormat local_208;
  long local_200;
  long local_1f8 [2];
  ConstPixelBufferAccess local_1e8;
  TextureFormat local_1c0;
  undefined1 local_1b8 [16];
  PixelBufferAccess local_1a8 [2];
  ios_base local_138 [264];
  
  vkd = Context::getDeviceInterface((this->super_TestInstance).m_context);
  device = Context::getDevice((this->super_TestInstance).m_context);
  local_1c0 = ::vk::mapVkFormat(*(VkFormat *)((long)&(this->m_testCase).range + 4));
  this_00 = (TextureLevel *)operator_new(0x28);
  tcu::TextureLevel::TextureLevel
            (this_00,&local_1c0,*(int *)((long)&(this->m_testCase).offset + 4),
             (int)(this->m_testCase).range,1);
  lVar2 = *(long *)&this[0xd].m_testCase.usage;
  size._0_4_ = (this->m_testCase).usage;
  size._4_4_ = (this->m_testCase).features;
  local_218.m_data.ptr = this_00;
  ::vk::invalidateMappedMemoryRange
            (vkd,device,(VkDeviceMemory)*(deUint64 *)(lVar2 + 8),*(VkDeviceSize *)(lVar2 + 0x10),
             size);
  tcu::PixelBufferAccess::PixelBufferAccess(local_1a8,local_218.m_data.ptr);
  local_208 = (local_218.m_data.ptr)->m_format;
  tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
            (&local_1e8,&local_208,&(local_218.m_data.ptr)->m_size,
             *(void **)(*(long *)&this[0xd].m_testCase.usage + 0x18));
  tcu::copy((EVP_PKEY_CTX *)local_1a8,(EVP_PKEY_CTX *)&local_1e8);
  tcu::TextureLevel::getAccess(local_1a8,local_218.m_data.ptr);
  local_1e8.m_format = local_1a8[0].super_ConstPixelBufferAccess.m_format;
  local_1e8.m_size.m_data[0] = local_1a8[0].super_ConstPixelBufferAccess.m_size.m_data[0];
  local_1e8.m_size.m_data[1] = local_1a8[0].super_ConstPixelBufferAccess.m_size.m_data[1];
  local_1e8.m_size.m_data[2] = local_1a8[0].super_ConstPixelBufferAccess.m_size.m_data[2];
  local_1e8.m_pitch.m_data[2] = local_1a8[0].super_ConstPixelBufferAccess.m_pitch.m_data[2];
  local_1e8.m_data = local_1a8[0].super_ConstPixelBufferAccess.m_data;
  if (0 < *(int *)((long)&(this->m_testCase).offset + 4)) {
    y = 0;
    do {
      tcu::ConstPixelBufferAccess::getPixelInt
                ((ConstPixelBufferAccess *)local_1b8,(int)&local_1e8,y,y);
      CVar3 = ((int)(this->m_testCase).offset + y) * (uint)(byte)factor;
      if (CVar3 != local_1b8._0_4_) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"BufferView test failed. expected: ",0x22);
        this_01 = (ostream *)std::ostream::operator<<(local_1a8,CVar3);
        std::__ostream_insert<char,std::char_traits<char>>(this_01," actual: ",9);
        std::ostream::operator<<(this_01,local_1b8._0_4_);
        std::__cxx11::stringbuf::str();
        __return_storage_ptr__->m_code = QP_TEST_RESULT_FAIL;
        (__return_storage_ptr__->m_description)._M_dataplus._M_p =
             (pointer)&(__return_storage_ptr__->m_description).field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&__return_storage_ptr__->m_description,local_208,
                   local_200 + (long)local_208);
        if (local_208 != (TextureFormat)local_1f8) {
          operator_delete((void *)local_208,local_1f8[0] + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
        std::ios_base::~ios_base(local_138);
        goto LAB_00412c6d;
      }
      y = y + 1;
    } while (y < *(int *)((long)&(this->m_testCase).offset + 4));
  }
  TVar1 = (TextureFormat)(local_1a8[0].super_ConstPixelBufferAccess.m_size.m_data + 2);
  local_1a8[0].super_ConstPixelBufferAccess.m_format = TVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"BufferView test","");
  __return_storage_ptr__->m_code = QP_TEST_RESULT_PASS;
  (__return_storage_ptr__->m_description)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->m_description).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&__return_storage_ptr__->m_description,
             local_1a8[0].super_ConstPixelBufferAccess.m_format,
             (undefined1 *)
             (local_1a8[0].super_ConstPixelBufferAccess.m_size.m_data._0_8_ +
             (long)local_1a8[0].super_ConstPixelBufferAccess.m_format));
  if (local_1a8[0].super_ConstPixelBufferAccess.m_format != TVar1) {
    operator_delete((void *)local_1a8[0].super_ConstPixelBufferAccess.m_format,
                    CONCAT44(local_1a8[0].super_ConstPixelBufferAccess.m_pitch.m_data[0],
                             local_1a8[0].super_ConstPixelBufferAccess.m_size.m_data[2]) + 1);
  }
LAB_00412c6d:
  de::details::UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>::reset
            (&local_218);
  return extraout_RAX;
}

Assistant:

tcu::TestStatus BufferViewTestInstance::checkResult (deInt8 factor)
{
	const DeviceInterface&			vk					= m_context.getDeviceInterface();
	const VkDevice					vkDevice			= m_context.getDevice();
	const tcu::TextureFormat		tcuFormat			= mapVkFormat(m_colorFormat);
	de::MovePtr<tcu::TextureLevel>	resultLevel			(new tcu::TextureLevel(tcuFormat, m_renderSize.x(), m_renderSize.y()));

	invalidateMappedMemoryRange(vk, vkDevice, m_resultBufferAlloc->getMemory(), m_resultBufferAlloc->getOffset(), m_pixelDataSize);
	tcu::copy(*resultLevel, tcu::ConstPixelBufferAccess(resultLevel->getFormat(), resultLevel->getSize(), m_resultBufferAlloc->getHostPtr()));

	tcu::ConstPixelBufferAccess pixelBuffer = resultLevel->getAccess();
	for (deInt32 i = 0; i < (deInt32) m_renderSize.x(); ++i)
	{
		tcu::IVec4 pixel	= pixelBuffer.getPixelInt(i, i);
		deInt32 expected	= factor * (m_testCase.elementOffset + i);
		deInt32 actual		= pixel[0];
		if (expected != actual)
		{
			std::ostringstream errorMessage;
			errorMessage << "BufferView test failed. expected: " << expected << " actual: " << actual;
			return tcu::TestStatus::fail(errorMessage.str());
		}
	}

	return tcu::TestStatus::pass("BufferView test");
}